

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcLits.c
# Opt level: O3

int Mvc_CoverIsOneLiteral(Mvc_Cover_t *pCover)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Mvc_Cube_t *pMVar4;
  uint uVar5;
  
  iVar3 = Mvc_CoverReadCubeNum(pCover);
  if (iVar3 == 1) {
    pMVar4 = Mvc_CoverReadCubeHead(pCover);
    iVar3 = 1;
    if (0 < pCover->nBits) {
      bVar1 = false;
      uVar5 = 0;
      do {
        bVar2 = bVar1;
        if (((pMVar4->pData[uVar5 >> 5] >> (uVar5 & 0x1f) & 1) != 0) && (bVar2 = true, bVar1))
        goto LAB_008c59a4;
        bVar1 = bVar2;
        uVar5 = uVar5 + 1;
      } while (pCover->nBits != uVar5);
    }
  }
  else {
LAB_008c59a4:
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int Mvc_CoverIsOneLiteral( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCube;
    int iBit, Counter, Value;
    if ( Mvc_CoverReadCubeNum(pCover) != 1 )
        return 0;
    pCube = Mvc_CoverReadCubeHead(pCover);
    // count literals
    Counter = 0;
    Mvc_CubeForEachBit( pCover, pCube, iBit, Value )
    {
        if ( Value )
        {
            if ( Counter++ )
                return 0;
        }
    }
    return 1;
}